

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_aead_transform(ptls_aead_context_t *ctx,void *output,size_t *outlen,void *input,
                       size_t inlen,uint8_t enc_content_type)

{
  ulong uVar1;
  size_t sVar2;
  char cVar3;
  byte bVar8;
  byte bVar12;
  short sVar14;
  ushort uVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  unkbyte10 Var20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  ulong uVar23;
  undefined4 uVar24;
  short sVar25;
  int iVar26;
  long lVar27;
  char cVar28;
  char cVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  ulong uVar33;
  undefined1 auVar34 [14];
  ulong uVar35;
  uint8_t iv [16];
  ulong local_18 [2];
  byte bVar4;
  char cVar5;
  byte bVar6;
  char cVar7;
  byte bVar9;
  char cVar10;
  char cVar11;
  byte bVar13;
  
  sVar2 = ctx->algo->iv_size;
  for (lVar27 = 0; sVar2 - 8 != lVar27; lVar27 = lVar27 + 1) {
    *(uint8_t *)((long)local_18 + lVar27) = ctx->static_iv[lVar27];
  }
  uVar1 = ctx->seq;
  auVar32._0_8_ = uVar1 >> 8;
  auVar32._8_8_ = uVar1;
  auVar32 = auVar32 & _DAT_001146e0;
  uVar33 = (ulong)DAT_001146e0;
  uVar23 = uVar1 >> 0x18 & uVar33;
  uVar35 = DAT_001146e0._8_8_;
  uVar30 = uVar1 >> 0x10 & uVar35;
  cVar28 = (char)(uVar30 >> 0x10);
  cVar29 = (char)(uVar30 >> 0x20);
  Var20 = CONCAT19((char)(uVar30 >> 8),CONCAT18((char)uVar30,uVar23));
  auVar21[10] = cVar28;
  auVar21._0_10_ = Var20;
  auVar21[0xb] = (char)(uVar30 >> 0x18);
  auVar22[0xc] = cVar29;
  auVar22._0_12_ = auVar21;
  auVar22[0xd] = (char)(uVar30 >> 0x28);
  sVar14 = (short)uVar23;
  cVar3 = (0 < sVar14) * (sVar14 < 0x100) * (char)uVar23 - (0xff < sVar14);
  sVar14 = (short)(uVar23 >> 0x10);
  uVar15 = (ushort)(uVar23 >> 0x20);
  bVar4 = (uVar15 != 0) * (uVar15 < 0x100) * (char)(uVar23 >> 0x20) - (0xff < uVar15);
  sVar16 = (short)((unkuint10)Var20 >> 0x40);
  cVar5 = (0 < sVar16) * (sVar16 < 0x100) * (char)uVar30 - (0xff < sVar16);
  sVar17 = auVar21._10_2_;
  sVar16 = auVar22._12_2_;
  bVar6 = (0 < sVar16) * (sVar16 < 0x100) * cVar29 - (0xff < sVar16);
  sVar16 = auVar32._0_2_;
  cVar29 = (0 < sVar16) * (sVar16 < 0x100) * auVar32[0] - (0xff < sVar16);
  sVar18 = auVar32._2_2_;
  sVar16 = auVar32._4_2_;
  cVar7 = (0 < sVar16) * (sVar16 < 0x100) * auVar32[4] - (0xff < sVar16);
  sVar19 = auVar32._6_2_;
  uVar30 = uVar1 >> 0x28 & uVar33;
  uVar31 = (ulong)(((unkuint9)(uint)(uVar1 >> 0x20) << 0x28) >> 0x28) & uVar35;
  uVar33 = uVar1 >> 0x38 & uVar33;
  uVar35 = (ulong)(((unkuint9)(ushort)(uVar1 >> 0x30) << 0x38) >> 0x38) & uVar35;
  uVar15 = (ushort)uVar33;
  bVar8 = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar33 - (0xff < uVar15);
  sVar16 = (short)uVar35;
  bVar9 = (0 < sVar16) * (sVar16 < 0x100) * (char)uVar35 - (0xff < sVar16);
  sVar16 = (short)uVar30;
  cVar10 = (0 < sVar16) * (sVar16 < 0x100) * (char)uVar30 - (0xff < sVar16);
  uVar15 = (ushort)(uVar30 >> 0x10);
  uVar15 = CONCAT11((uVar15 != 0) * (uVar15 < 0x100) * (char)(uVar30 >> 0x10) - (0xff < uVar15),
                    cVar10);
  auVar34._0_12_ = ZEXT212(uVar15) << 0x40;
  sVar16 = (short)uVar31;
  cVar11 = (0 < sVar16) * (sVar16 < 0x100) * (char)uVar31 - (0xff < sVar16);
  auVar34[0xc] = cVar11;
  sVar16 = (short)(uVar31 >> 0x10);
  auVar34[0xd] = (0 < sVar16) * (sVar16 < 0x100) * (char)(uVar31 >> 0x10) - (0xff < sVar16);
  sVar16 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * (char)(uVar23 >> 0x10) - (0xff < sVar14),cVar3
                   );
  sVar25 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * cVar28 - (0xff < sVar17),cVar5);
  sVar17 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar32[2] - (0xff < sVar18),cVar29);
  bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
  bVar9 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
  bVar12 = (0 < (short)uVar15) * ((short)uVar15 < 0x100) * cVar10 - (0xff < (short)uVar15);
  sVar14 = auVar34._12_2_;
  bVar13 = (0 < sVar14) * (sVar14 < 0x100) * cVar11 - (0xff < sVar14);
  cVar3 = (0 < sVar16) * (sVar16 < 0x100) * cVar3 - (0xff < sVar16);
  sVar18 = CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),cVar3);
  cVar5 = (0 < sVar25) * (sVar25 < 0x100) * cVar5 - (0xff < sVar25);
  uVar24 = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),CONCAT12(cVar5,sVar18));
  cVar29 = (0 < sVar17) * (sVar17 < 0x100) * cVar29 - (0xff < sVar17);
  sVar16 = (short)(CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar32[6] - (0xff < sVar19),
                            CONCAT12(cVar7,sVar17)) >> 0x10);
  sVar14 = (short)((uint)uVar24 >> 0x10);
  sVar16 = (short)(CONCAT15((0 < sVar16) * (sVar16 < 0x100) * cVar7 - (0xff < sVar16),
                            CONCAT14(cVar29,uVar24)) >> 0x20);
  *(ulong *)((long)local_18 + lVar27) =
       (ulong)CONCAT16((0 < sVar16) * (sVar16 < 0x100) * cVar29 - (0xff < sVar16),
                       CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar5 - (0xff < sVar14),
                                CONCAT14((0 < sVar18) * (sVar18 < 0x100) * cVar3 - (0xff < sVar18),
                                         CONCAT13((bVar13 != 0) * (bVar13 < 0x100) * bVar13 -
                                                  (0xff < bVar13),
                                                  CONCAT12((bVar12 != 0) * (bVar12 < 0x100) * bVar12
                                                           - (0xff < bVar12),
                                                           CONCAT11((bVar9 != 0) * (bVar9 < 0x100) *
                                                                    bVar9 - (0xff < bVar9),
                                                                    (bVar8 != 0) * (bVar8 < 0x100) *
                                                                    bVar8 - (0xff < bVar8))))))) ^
       *(ulong *)(ctx->static_iv + lVar27);
  iVar26 = (*ctx->do_transform)(ctx,output,outlen,input,inlen,local_18,enc_content_type);
  if (iVar26 == 0) {
    ctx->seq = ctx->seq + 1;
  }
  return iVar26;
}

Assistant:

int ptls_aead_transform(ptls_aead_context_t *ctx, void *output, size_t *outlen, const void *input, size_t inlen,
                        uint8_t enc_content_type)
{
    uint8_t iv[PTLS_MAX_IV_SIZE];
    size_t iv_size = ctx->algo->iv_size;
    int ret;

    { /* build iv */
        const uint8_t *s = ctx->static_iv;
        uint8_t *d = iv;
        size_t i = iv_size - 8;
        for (; i != 0; --i)
            *d++ = *s++;
        i = 64;
        do {
            i -= 8;
            *d++ = *s++ ^ (uint8_t)(ctx->seq >> i);
        } while (i != 0);
    }

    if ((ret = ctx->do_transform(ctx, output, outlen, input, inlen, iv, enc_content_type)) != 0)
        return ret;

    ++ctx->seq;
    return 0;
}